

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O1

int32_t __thiscall
icu_63::UCharsTrieBuilder::skipElementsBySomeUnits
          (UCharsTrieBuilder *this,int32_t i,int32_t unitIndex,int32_t count)

{
  short sVar1;
  bool bVar2;
  char16_t cVar3;
  uint uVar4;
  uint uVar5;
  char16_t *pcVar6;
  char16_t cVar7;
  UCharsTrieElement *pUVar8;
  
  sVar1 = (this->strings).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar5 = *(uint *)((long)&(this->strings).fUnion + 4);
  }
  else {
    uVar5 = (int)sVar1 >> 5;
  }
  if (((int)sVar1 & 2U) == 0) {
    pcVar6 = (this->strings).fUnion.fFields.fArray;
  }
  else {
    pcVar6 = (char16_t *)((long)&(this->strings).fUnion + 2);
  }
  do {
    uVar4 = this->elements[i].stringOffset + unitIndex + 1;
    cVar7 = L'\xffff';
    if (uVar4 < uVar5) {
      cVar7 = pcVar6[(int)uVar4];
    }
    pUVar8 = this->elements + (long)i + 1;
    do {
      uVar4 = pUVar8->stringOffset + unitIndex + 1;
      cVar3 = L'\xffff';
      if (uVar4 < uVar5) {
        cVar3 = pcVar6[(int)uVar4];
      }
      i = i + 1;
      pUVar8 = pUVar8 + 1;
    } while (cVar7 == cVar3);
    bVar2 = 1 < count;
    count = count + -1;
  } while (bVar2);
  return i;
}

Assistant:

int32_t
UCharsTrieBuilder::skipElementsBySomeUnits(int32_t i, int32_t unitIndex, int32_t count) const {
    do {
        UChar unit=elements[i++].charAt(unitIndex, strings);
        while(unit==elements[i].charAt(unitIndex, strings)) {
            ++i;
        }
    } while(--count>0);
    return i;
}